

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

uoffset64_t __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::ReferTo
          (FlatBufferBuilderImpl<false> *this,uoffset64_t off)

{
  SizeT size;
  unsigned_long uVar1;
  uoffset64_t off_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  Align(this,8);
  size = GetSize(this);
  uVar1 = ReferTo<unsigned_long,unsigned_int>(this,off,size);
  return uVar1;
}

Assistant:

uoffset64_t ReferTo(uoffset64_t off) {
    // Align to ensure GetSize() below is correct.
    Align(sizeof(uoffset64_t));
    // 64-bit offsets are relative to tail of the whole buffer
    return ReferTo(off, GetSize());
  }